

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageFilledPolygon(gdImagePtr im,gdPointPtr p,int n,int c)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  gdPointPtr pgVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  gdPointPtr pgVar10;
  long lVar11;
  int iVar12;
  gdPointPtr pgVar13;
  uint uVar14;
  int color;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  
  if (n < 1) {
    return;
  }
  color = c;
  if (c == -7) {
    color = im->AA_color;
  }
  if (im->polyAllocated == 0) {
    iVar1 = overflow2(4,n);
    if (iVar1 != 0) {
      return;
    }
    piVar3 = (int *)gdMalloc((ulong)(uint)n << 2);
    im->polyInts = piVar3;
    if (piVar3 == (int *)0x0) {
      return;
    }
    im->polyAllocated = n;
  }
  if (im->polyAllocated < n) {
    iVar1 = im->polyAllocated;
    if (iVar1 < n) {
      do {
        iVar1 = iVar1 * 2;
      } while (iVar1 < n);
      im->polyAllocated = iVar1;
    }
    iVar1 = overflow2(4,iVar1);
    if (iVar1 != 0) {
      return;
    }
    piVar3 = (int *)gdReallocEx(im->polyInts,(long)im->polyAllocated << 2);
    im->polyInts = piVar3;
    if (piVar3 == (int *)0x0) {
      return;
    }
  }
  iVar1 = p->y;
  iVar2 = iVar1;
  if (n != 1) {
    uVar15 = 2;
    if (2 < n) {
      uVar15 = (ulong)(uint)n;
    }
    lVar11 = 0;
    do {
      iVar16 = p[lVar11 + 1].y;
      if (iVar16 < iVar2) {
        iVar2 = iVar16;
      }
      if (iVar1 < iVar16) {
        iVar1 = iVar16;
      }
      lVar11 = lVar11 + 1;
    } while (uVar15 - 1 != lVar11);
  }
  iVar16 = im->cy1;
  if (im->cy1 < iVar2) {
    iVar16 = iVar2;
  }
  iVar2 = im->cy2;
  if (iVar1 < im->cy2) {
    iVar2 = iVar1;
  }
  if (iVar16 <= iVar2) {
    uVar15 = 1;
    if (1 < n) {
      uVar15 = (ulong)(uint)n;
    }
    do {
      uVar5 = 0;
      uVar7 = 0;
      pgVar4 = p;
      do {
        uVar6 = uVar5 & 0xffffffff;
        if (uVar5 == 0) {
          uVar6 = (ulong)(uint)n;
        }
        pgVar13 = p + (uVar6 - 1);
        iVar9 = p[uVar6 - 1].y;
        iVar8 = pgVar4->y;
        pgVar10 = pgVar4;
        iVar12 = iVar8;
        if ((iVar9 < iVar8) ||
           (bVar17 = iVar8 < iVar9, pgVar10 = pgVar13, pgVar13 = pgVar4, iVar12 = iVar9,
           iVar9 = iVar8, bVar17)) {
          iVar8 = pgVar10->x;
          if ((iVar16 < iVar9) || (iVar12 <= iVar16)) {
            if ((iVar16 != iVar1) || (iVar16 != iVar12)) goto LAB_0010f14d;
          }
          else {
            iVar8 = (int)((float)pgVar13->x +
                         (float)((iVar8 - pgVar13->x) * (iVar16 - iVar9)) / (float)(iVar12 - iVar9)
                         + 0.5);
          }
          lVar11 = (long)(int)uVar7;
          uVar7 = uVar7 + 1;
          im->polyInts[lVar11] = iVar8;
        }
LAB_0010f14d:
        uVar5 = uVar5 + 1;
        pgVar4 = pgVar4 + 1;
      } while (uVar15 != uVar5);
      if (1 < (int)uVar7) {
        piVar3 = im->polyInts;
        uVar5 = 1;
        iVar9 = 2;
        do {
          iVar8 = piVar3[uVar5];
          iVar12 = iVar9;
          do {
            uVar14 = iVar12 - 1;
            if (piVar3[(ulong)uVar14 - 1] <= iVar8) goto LAB_0010f199;
            piVar3[uVar14] = piVar3[(ulong)uVar14 - 1];
            iVar12 = iVar12 + -1;
          } while (1 < iVar12);
          uVar14 = 0;
LAB_0010f199:
          piVar3[(int)uVar14] = iVar8;
          uVar5 = uVar5 + 1;
          iVar9 = iVar9 + 1;
        } while (uVar5 != uVar7);
      }
      if (1 < (int)uVar7) {
        lVar11 = 0;
        do {
          gdImageLine(im,im->polyInts[lVar11],iVar16,im->polyInts[lVar11 + 1],iVar16,color);
          lVar11 = lVar11 + 2;
        } while ((int)lVar11 < (int)(uVar7 - 1));
      }
      bVar17 = iVar16 != iVar2;
      iVar16 = iVar16 + 1;
    } while (bVar17);
  }
  if (c != -7) {
    return;
  }
  gdImagePolygon(im,p,n,-7);
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledPolygon (gdImagePtr im, gdPointPtr p, int n, int c)
{
	int i;
	int j;
	int index;
	int y;
	int miny, maxy, pmaxy;
	int x1, y1;
	int x2, y2;
	int ind1, ind2;
	int ints;
	int fill_color;
	if (n <= 0) {
		return;
	}

	if (c == gdAntiAliased) {
		fill_color = im->AA_color;
	} else {
		fill_color = c;
	}
	if (!im->polyAllocated) {
		if (overflow2(sizeof (int), n)) {
			return;
		}
		im->polyInts = (int *) gdMalloc (sizeof (int) * n);
		if (!im->polyInts) {
			return;
		}
		im->polyAllocated = n;
	}
	if (im->polyAllocated < n) {
		while (im->polyAllocated < n) {
			im->polyAllocated *= 2;
		}
		if (overflow2(sizeof (int), im->polyAllocated)) {
			return;
		}
		im->polyInts = (int *) gdReallocEx (im->polyInts,
						    sizeof (int) * im->polyAllocated);
		if (!im->polyInts) {
			return;
		}
	}
	miny = p[0].y;
	maxy = p[0].y;
	for (i = 1; (i < n); i++) {
		if (p[i].y < miny) {
			miny = p[i].y;
		}
		if (p[i].y > maxy) {
			maxy = p[i].y;
		}
	}
	pmaxy = maxy;
	/* 2.0.16: Optimization by Ilia Chipitsine -- don't waste time offscreen */
	/* 2.0.26: clipping rectangle is even better */
	if (miny < im->cy1) {
		miny = im->cy1;
	}
	if (maxy > im->cy2) {
		maxy = im->cy2;
	}
	/* Fix in 1.3: count a vertex only once */
	for (y = miny; (y <= maxy); y++) {
		ints = 0;
		for (i = 0; (i < n); i++) {
			if (!i) {
				ind1 = n - 1;
				ind2 = 0;
			} else {
				ind1 = i - 1;
				ind2 = i;
			}
			y1 = p[ind1].y;
			y2 = p[ind2].y;
			if (y1 < y2) {
				x1 = p[ind1].x;
				x2 = p[ind2].x;
			} else if (y1 > y2) {
				y2 = p[ind1].y;
				y1 = p[ind2].y;
				x2 = p[ind1].x;
				x1 = p[ind2].x;
			} else {
				continue;
			}

			/* Do the following math as float intermediately, and round to ensure
			 * that Polygon and FilledPolygon for the same set of points have the
			 * same footprint. */

			if ((y >= y1) && (y < y2)) {
				im->polyInts[ints++] = (int) ((float) ((y - y1) * (x2 - x1)) /
				                              (float) (y2 - y1) + 0.5 + x1);
			} else if ((y == pmaxy) && (y == y2)) {
				im->polyInts[ints++] = x2;
			}
		}
		/*
		  2.0.26: polygons pretty much always have less than 100 points,
		  and most of the time they have considerably less. For such trivial
		  cases, insertion sort is a good choice. Also a good choice for
		  future implementations that may wish to indirect through a table.
		*/
		for (i = 1; (i < ints); i++) {
			index = im->polyInts[i];
			j = i;
			while ((j > 0) && (im->polyInts[j - 1] > index)) {
				im->polyInts[j] = im->polyInts[j - 1];
				j--;
			}
			im->polyInts[j] = index;
		}
		for (i = 0; (i < (ints-1)); i += 2) {
			/* 2.0.29: back to gdImageLine to prevent segfaults when
			  performing a pattern fill */
			gdImageLine (im, im->polyInts[i], y, im->polyInts[i + 1], y,
			             fill_color);
		}
	}
	/* If we are drawing this AA, then redraw the border with AA lines. */
	/* This doesn't work as well as I'd like, but it doesn't clash either. */
	if (c == gdAntiAliased) {
		gdImagePolygon (im, p, n, c);
	}
}